

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O3

JL_STATUS JlDetachObjectFromDictionaryObject(JlDataObject *DictionaryObject,char *KeyName)

{
  char *__s2;
  JlDataObject *pJVar1;
  int iVar2;
  JL_STATUS JVar3;
  JlDictionaryItem *Memory;
  JlDictionaryItem *pJVar4;
  JlDictionaryItem *pJVar5;
  
  JVar3 = JL_STATUS_INVALID_PARAMETER;
  if (((KeyName != (char *)0x0 && DictionaryObject != (JlDataObject *)0x0) && (*KeyName != '\0')) &&
     (JVar3 = JL_STATUS_WRONG_TYPE, DictionaryObject->Type == JL_DATA_TYPE_DICTIONARY)) {
    Memory = (JlDictionaryItem *)&DictionaryObject->field_2;
    pJVar4 = (JlDictionaryItem *)0x0;
    do {
      pJVar5 = pJVar4;
      Memory = Memory->Next;
      if (Memory == (JlDictionaryItem *)0x0) {
        return JL_STATUS_NOT_FOUND;
      }
      __s2 = Memory->KeyName;
      iVar2 = strcmp(KeyName,__s2);
      pJVar4 = Memory;
    } while (iVar2 != 0);
    pJVar4 = (JlDictionaryItem *)&DictionaryObject->field_2;
    if (pJVar5 != (JlDictionaryItem *)0x0) {
      pJVar4 = pJVar5;
    }
    pJVar1 = Memory->Object;
    pJVar4->Next = Memory->Next;
    if (Memory == (JlDictionaryItem *)(DictionaryObject->field_2).List.ListHead) {
      (DictionaryObject->field_2).List.ListHead = (JlListItem *)pJVar5;
    }
    WjTestLib_Free(__s2);
    WjTestLib_Free(Memory);
    JVar3 = (uint)(pJVar1 != (JlDataObject *)0x0) * 8 + JL_STATUS_NOT_FOUND;
  }
  return JVar3;
}

Assistant:

JL_STATUS
    JlDetachObjectFromDictionaryObject
    (
        JlDataObject*   DictionaryObject,
        char const*     KeyName
    )
{
    JL_STATUS jlStatus;

    if(     NULL != DictionaryObject
        &&  NULL != KeyName
        &&  0 != KeyName[0] )
    {
        if( JL_DATA_TYPE_DICTIONARY == DictionaryObject->Type )
        {
            // Find and detach object
            JlDataObject* object = FindAndDetachDictionaryItem( &DictionaryObject->Dictionary, KeyName );
            if( NULL != object )
            {
                // object is now detached from the dictionary.
                jlStatus = JL_STATUS_SUCCESS;
            }
            else
            {
                jlStatus = JL_STATUS_NOT_FOUND;
            }
        }
        else
        {
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}